

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O1

void __thiscall
Catch::
Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
::~Singleton(Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             *this)

{
  (this->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub =
       (_func_int **)&PTR__RegistryHub_001adba8;
  (this->super_RegistryHub).super_IMutableRegistryHub._vptr_IMutableRegistryHub =
       (_func_int **)&PTR__RegistryHub_001adc28;
  (this->super_RegistryHub).super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__RegistryHub_001adc80;
  (this->super_RegistryHub).m_enumValuesRegistry.super_IMutableEnumValuesRegistry.
  _vptr_IMutableEnumValuesRegistry = (_func_int **)&PTR__EnumValuesRegistry_001ac790;
  clara::std::
  vector<std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>,_std::allocator<std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>_>_>
  ::~vector(&(this->super_RegistryHub).m_enumValuesRegistry.m_enumInfos);
  clara::std::
  vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
  ::~vector(&(this->super_RegistryHub).m_exceptionRegistry.m_exceptions);
  (this->super_RegistryHub).m_tagAliasRegistry.super_ITagAliasRegistry._vptr_ITagAliasRegistry =
       (_func_int **)&PTR__TagAliasRegistry_001abe08;
  clara::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>_>
  ::~_Rb_tree(&(this->super_RegistryHub).m_tagAliasRegistry.m_registry._M_t);
  (this->super_RegistryHub).m_exceptionTranslatorRegistry.super_IExceptionTranslatorRegistry.
  _vptr_IExceptionTranslatorRegistry = (_func_int **)&PTR__ExceptionTranslatorRegistry_001ab7d0;
  clara::std::
  vector<std::unique_ptr<const_Catch::IExceptionTranslator,_std::default_delete<const_Catch::IExceptionTranslator>_>,_std::allocator<std::unique_ptr<const_Catch::IExceptionTranslator,_std::default_delete<const_Catch::IExceptionTranslator>_>_>_>
  ::~vector(&(this->super_RegistryHub).m_exceptionTranslatorRegistry.m_translators);
  (this->super_RegistryHub).m_reporterRegistry.super_IReporterRegistry._vptr_IReporterRegistry =
       (_func_int **)&PTR__ReporterRegistry_001abba8;
  clara::std::
  vector<std::shared_ptr<Catch::IReporterFactory>,_std::allocator<std::shared_ptr<Catch::IReporterFactory>_>_>
  ::~vector(&(this->super_RegistryHub).m_reporterRegistry.m_listeners);
  clara::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
  ::~_Rb_tree(&(this->super_RegistryHub).m_reporterRegistry.m_factories._M_t);
  TestRegistry::~TestRegistry(&(this->super_RegistryHub).m_testCaseRegistry);
  operator_delete(this);
  return;
}

Assistant:

static auto getInternal() -> Singleton* {
            static Singleton* s_instance = nullptr;
            if( !s_instance ) {
                s_instance = new Singleton;
                addSingleton( s_instance );
            }
            return s_instance;
        }